

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::MinTypMaxExpressionSyntax::setChild
          (MinTypMaxExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00aaf164 + *(int *)(&DAT_00aaf164 + in_RSI * 4)))();
  return;
}

Assistant:

void MinTypMaxExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: min = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: colon1 = child.token(); return;
        case 2: typ = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: colon2 = child.token(); return;
        case 4: max = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}